

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataDevice.cpp
# Opt level: O0

int __thiscall
remote_wiring::FirmataDevice::_analogWrite(FirmataDevice *this,size_t pin_,size_t value_)

{
  bool bVar1;
  uint8_t pin;
  int *piVar2;
  int local_24;
  int error;
  size_t value__local;
  size_t pin__local;
  FirmataDevice *this_local;
  
  if (pin_ < this->_pin_count) {
    if ((this->_pin_info_cache == (WiringPinInfo *)0x0) ||
       (bVar1 = WiringPinInfo::analogWriteAvailable(this->_pin_info_cache + pin_), bVar1)) {
      pin = (uint8_t)pin_;
      if (((ulong)this->_pin_state_cache[pin_] & 0xff) == 2) {
        firmata::FirmataMarshaller::sendAnalog(&this->_marshaller,pin,(uint16_t)value_);
        serial_wiring::Stream::flush(this->_stream);
      }
      else {
        *(uint *)(this->_pin_state_cache + pin_) =
             *(uint *)(this->_pin_state_cache + pin_) & 0xffffff00 | 2;
        firmata::FirmataMarshaller::sendPinMode(&this->_marshaller,pin,'\x03');
        firmata::FirmataMarshaller::sendAnalog(&this->_marshaller,pin,(uint16_t)value_);
        serial_wiring::Stream::flush(this->_stream);
      }
      local_24 = 0;
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x5f;
      local_24 = 0x5f;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 6;
    local_24 = 6;
  }
  return local_24;
}

Assistant:

int
FirmataDevice::_analogWrite (
    const size_t pin_,
    const size_t value_
) {
    int error;

    if ( pin_ >= _pin_count ) {
        error = errno = ENXIO;
#ifdef LOG_ERRORS
        ::perror("FirmataDevice::analogWrite - Pin out of bounds!");
#endif
    } else if ( _pin_info_cache && !_pin_info_cache[pin_].analogWriteAvailable() ) {
        error = errno = EOPNOTSUPP;
#ifdef LOG_ERRORS
        ::perror("FirmataDevice::analogWrite - Pin incapable of analog write functionality!");
#endif
    } else if ( ANALOG_WRITE != _pin_state_cache[pin_].mode ) {
        error = 0;
        _pin_state_cache[pin_].mode = ANALOG_WRITE;
        _marshaller.sendPinMode(static_cast<uint8_t>(pin_), firmata::PIN_MODE_PWM);
        _marshaller.sendAnalog(static_cast<uint8_t>(pin_), value_);
        _stream.flush();
    } else {
        error = 0;
        _marshaller.sendAnalog(static_cast<uint8_t>(pin_), value_);
        _stream.flush();
    }

    return error;
}